

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall
backend::codegen::RegAllocator::replace_write(RegAllocator *this,ReplaceWriteAction r,int i)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  type pIVar4;
  Timestamp *timestamp;
  Function *pFVar5;
  uint in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>,_bool>
  pVar6;
  add_pointer_t<arm::MemoryOperand> x__;
  LoadStoreInst *x_;
  value_type *x;
  bool del;
  int pos;
  Reg rd;
  anon_class_16_2_94732020 disp_reg;
  value_type *in_stack_fffffffffffff978;
  Function *in_stack_fffffffffffff980;
  string *in_stack_fffffffffffff988;
  string *name;
  Function *in_stack_fffffffffffff990;
  Function *this_00;
  MemoryOperand *in_stack_fffffffffffff998;
  Function *in_stack_fffffffffffff9a8;
  RegAllocator *in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  ConditionCode *in_stack_fffffffffffff9e0;
  MemoryOperand *in_stack_fffffffffffff9e8;
  uint *in_stack_fffffffffffff9f0;
  OpCode *in_stack_fffffffffffff9f8;
  Timestamp *in_stack_fffffffffffffa08;
  ostream *in_stack_fffffffffffffa10;
  bool local_5c1;
  long local_5c0;
  Severity *in_stack_fffffffffffffa78;
  ostream *in_stack_fffffffffffffa80;
  undefined1 local_4f9 [40];
  undefined1 local_4d1 [121];
  time_point_sys_clock local_458;
  Timestamp local_450 [3];
  undefined1 local_402;
  allocator<char> local_401;
  anon_class_16_2_94732020 *in_stack_fffffffffffffc00;
  allocator<char> local_3d9;
  string local_3d8 [120];
  time_point_sys_clock local_360;
  Timestamp local_358 [3];
  undefined1 local_309;
  ostream local_308 [52];
  undefined4 local_2d4;
  add_pointer_t<arm::MemoryOperand> local_290;
  long local_288;
  reference local_280;
  byte local_275;
  int local_274;
  Reg local_270;
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [120];
  time_point_sys_clock local_1c8;
  Timestamp local_1c0 [3];
  undefined1 local_172;
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [120];
  time_point_sys_clock local_d0;
  Timestamp local_c8 [3];
  undefined1 local_69;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_68;
  undefined1 local_60;
  Interval local_54;
  pair<const_unsigned_int,_backend::codegen::Interval> local_4c;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 local_2c [32];
  undefined1 local_c [4];
  Reg aRStack_8 [2];
  
  local_270 = (Reg)((ulong)in_RSI >> 0x20);
  local_40 = local_c;
  local_38 = local_2c;
  if (in_EDX == 0) {
    aRStack_8[0] = local_270;
    Interval::Interval(&local_54,in_ECX,0xffffffff);
    std::pair<const_unsigned_int,_backend::codegen::Interval>::
    pair<unsigned_int_&,_backend::codegen::Interval,_true>(&local_4c,aRStack_8,&local_54);
    pVar6 = std::
            unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
            ::insert((unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
                      *)in_stack_fffffffffffff990,(value_type *)in_stack_fffffffffffff988);
    local_68._M_cur =
         (__node_type *)
         pVar6.first.
         super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
         ._M_cur;
    local_60 = pVar6.second;
    replace_write::anon_class_16_2_94732020::operator()(in_stack_fffffffffffffc00);
    local_69 = 0;
    AixLog::operator<<(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    AixLog::Tag::Tag((Tag *)0x240cc7);
    AixLog::operator<<((ostream *)in_stack_fffffffffffff9b0,(Tag *)in_stack_fffffffffffff9a8);
    local_d0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_c8,&local_d0);
    AixLog::operator<<(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (allocator<char> *)in_stack_fffffffffffff9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (allocator<char> *)in_stack_fffffffffffff9b0);
    AixLog::Function::Function
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               (string *)in_stack_fffffffffffff980,(size_t)in_stack_fffffffffffff978);
    poVar1 = AixLog::operator<<((ostream *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    poVar1 = std::operator<<(poVar1,"phys ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,aRStack_8[0]);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffff980);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    AixLog::Timestamp::~Timestamp(local_c8);
    AixLog::Tag::~Tag((Tag *)0x240e7f);
  }
  else if (in_EDX == 1) {
    replace_write::anon_class_16_2_94732020::operator()(in_stack_fffffffffffffc00);
    local_172 = 0;
    AixLog::operator<<(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    AixLog::Tag::Tag((Tag *)0x240fc0);
    AixLog::operator<<((ostream *)in_stack_fffffffffffff9b0,(Tag *)in_stack_fffffffffffff9a8);
    local_1c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_1c0,&local_1c8);
    AixLog::operator<<(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (allocator<char> *)in_stack_fffffffffffff9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (allocator<char> *)in_stack_fffffffffffff9b0);
    AixLog::Function::Function
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               (string *)in_stack_fffffffffffff980,(size_t)in_stack_fffffffffffff978);
    poVar1 = AixLog::operator<<((ostream *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    poVar1 = std::operator<<(poVar1,"graph");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffff980);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator(&local_241);
    AixLog::Timestamp::~Timestamp(local_1c0);
    AixLog::Tag::~Tag((Tag *)0x24115a);
  }
  else if (in_EDX == 2) {
    local_274 = get_or_alloc_spill_pos
                          (in_stack_fffffffffffff9b0,(Reg)((ulong)in_stack_fffffffffffff9a8 >> 0x20)
                          );
    local_275 = 0;
    sVar3 = std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::size((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    *)(in_RDI + 0x328));
    if (sVar3 != 0) {
      local_280 = std::
                  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  ::back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                          *)in_stack_fffffffffffff980);
      pIVar4 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                         ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                          in_stack_fffffffffffff980);
      if (pIVar4 == (type)0x0) {
        local_5c0 = 0;
      }
      else {
        local_5c0 = __dynamic_cast(pIVar4,&arm::Inst::typeinfo,&arm::LoadStoreInst::typeinfo,0);
      }
      local_288 = local_5c0;
      if (local_5c0 != 0) {
        local_290 = std::get_if<arm::MemoryOperand,std::__cxx11::string,arm::MemoryOperand>
                              ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                                *)0x241340);
        local_5c1 = false;
        if (((*(int *)(local_288 + 8) == 0x1c) && (local_5c1 = false, local_290->r1 == local_270))
           && (local_5c1 = false, *(char *)(local_288 + 0xc) == *(char *)(in_RDI + 0x3ee))) {
          arm::MemoryOperand::MemoryOperand
                    ((MemoryOperand *)in_stack_fffffffffffff980,
                     (Reg)((ulong)in_stack_fffffffffffff978 >> 0x20),
                     (int16_t)((ulong)in_stack_fffffffffffff978 >> 0x10),
                     (MemoryAccessKind)((ulong)in_stack_fffffffffffff978 >> 8));
          local_5c1 = arm::MemoryOperand::operator==
                                (in_stack_fffffffffffff998,
                                 (MemoryOperand *)in_stack_fffffffffffff990);
        }
        if (local_5c1 != false) {
          local_275 = 1;
        }
      }
    }
    if ((local_275 & 1) == 0) {
      local_2d4 = 0x1c;
      in_stack_fffffffffffffa10 = local_308;
      arm::MemoryOperand::MemoryOperand
                ((MemoryOperand *)in_stack_fffffffffffff980,
                 (Reg)((ulong)in_stack_fffffffffffff978 >> 0x20),
                 (int16_t)((ulong)in_stack_fffffffffffff978 >> 0x10),
                 (MemoryAccessKind)((ulong)in_stack_fffffffffffff978 >> 8));
      std::
      make_unique<arm::LoadStoreInst,arm::OpCode,unsigned_int&,arm::MemoryOperand,arm::ConditionCode&>
                (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                 in_stack_fffffffffffff9e0);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::LoadStoreInst,std::default_delete<arm::LoadStoreInst>,void>
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff990
                 ,(unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)
                  in_stack_fffffffffffff988);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff990
                );
      std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
                ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)
                 in_stack_fffffffffffff980);
    }
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *)in_stack_fffffffffffff980,(key_type *)in_stack_fffffffffffff978);
    replace_write::anon_class_16_2_94732020::operator()(in_stack_fffffffffffffc00);
    local_309 = 0;
    AixLog::operator<<(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    AixLog::Tag::Tag((Tag *)0x241596);
    timestamp = (Timestamp *)
                AixLog::operator<<((ostream *)in_stack_fffffffffffff9b0,
                                   (Tag *)in_stack_fffffffffffff9a8);
    local_360.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_358,&local_360);
    AixLog::operator<<(in_stack_fffffffffffffa10,timestamp);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (allocator<char> *)in_stack_fffffffffffff9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (allocator<char> *)in_stack_fffffffffffff9b0);
    AixLog::Function::Function
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               (string *)in_stack_fffffffffffff980,(size_t)in_stack_fffffffffffff978);
    poVar1 = AixLog::operator<<((ostream *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    poVar1 = std::operator<<(poVar1,"spill ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_274);
    poVar1 = std::operator<<(poVar1," ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(local_275 & 1));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffff980);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc00);
    std::allocator<char>::~allocator(&local_401);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    AixLog::Timestamp::~Timestamp(local_358);
    AixLog::Tag::~Tag((Tag *)0x24175e);
  }
  else {
    replace_write::anon_class_16_2_94732020::operator()(in_stack_fffffffffffffc00);
    local_402 = 0;
    AixLog::operator<<(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    pFVar5 = (Function *)(local_450 + 1);
    AixLog::Tag::Tag((Tag *)0x24188b);
    poVar1 = AixLog::operator<<((ostream *)in_stack_fffffffffffff9b0,(Tag *)pFVar5);
    local_458.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_450,&local_458);
    AixLog::operator<<(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    this_00 = (Function *)local_4d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(allocator<char> *)poVar1);
    name = (string *)local_4f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(allocator<char> *)poVar1);
    AixLog::Function::Function
              (this_00,name,(string *)in_stack_fffffffffffff980,(size_t)in_stack_fffffffffffff978);
    pFVar5 = (Function *)AixLog::operator<<(poVar1,pFVar5);
    poVar1 = std::operator<<((ostream *)pFVar5,"temp");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(pFVar5);
    std::__cxx11::string::~string((string *)(local_4f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4f9);
    std::__cxx11::string::~string((string *)(local_4d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4d1);
    AixLog::Timestamp::~Timestamp(local_450);
    AixLog::Tag::~Tag((Tag *)0x2419f9);
  }
  return;
}

Assistant:

void RegAllocator::replace_write(ReplaceWriteAction r, int i) {
  auto disp_reg = [&]() {
    display_reg_name(LOG(TRACE), r.from);
    LOG(TRACE) << " at: " << i << " ";
  };
  if (r.kind == ReplaceWriteKind::Phys) {
    // is physical register; mark as occupied
    active.insert({r.replace_with, Interval(i, UINT32_MAX)});
    disp_reg();
    LOG(TRACE) << "phys " << r.replace_with << std::endl;
    return;
  } else if (r.kind == ReplaceWriteKind::Graph) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph" << std::endl;
  } else if (r.kind == ReplaceWriteKind::Spill) {
    // this register is allocated in stack
    Reg rd = r.replace_with;
    int pos = get_or_alloc_spill_pos(r.from);

    bool del = false;
    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x__->r1 == rd &&
            x_->cond == cur_cond &&
            (*x__) == MemoryOperand(REG_SP, pos + stack_offset)) {
          del = true;
        }
      }
    }
    if (!del) {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::StR, rd, MemoryOperand(REG_SP, pos + stack_offset),
          cur_cond));
    }
    wrote_to.erase(r.from);
    disp_reg();
    LOG(TRACE) << "spill " << pos << " " << del << std::endl;
  } else {
    disp_reg();
    LOG(TRACE) << "temp" << std::endl;
    // Is temporary register
    // the register should already be written to or read from

    // throw new std::logic_error("Writing to transient register");
  }
}